

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall
am_CList::Remove_Any_Overridden_By(am_CList *this,Am_Slot *slot,Am_Constraint *competing_constraint)

{
  CItem *pCVar1;
  CItem *constraint_tag;
  int iVar2;
  
  pCVar1 = this->head;
  while (constraint_tag = pCVar1, constraint_tag != (CItem *)0x0) {
    pCVar1 = constraint_tag->next;
    iVar2 = (*(constraint_tag->value->super_Am_Registered_Type)._vptr_Am_Registered_Type[0x10])
                      (constraint_tag->value,slot,competing_constraint);
    if ((char)iVar2 != '\0') {
      Am_Slot::Remove_Constraint(slot,constraint_tag);
    }
  }
  return;
}

Assistant:

void
am_CList::Remove_Any_Overridden_By(const Am_Slot &slot,
                                   Am_Constraint *competing_constraint)
{
  CItem *next;
  for (CItem *current = head; current != nullptr; current = next) {
    next = current->next;
    if (current->value->Is_Overridden_By(slot, competing_constraint))
      // remove it
      slot.Remove_Constraint(current);
  }
}